

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_fp.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  long lVar6;
  FILE *__s;
  char *pcVar7;
  bool bVar8;
  void *arkode_mem;
  SUNContext ctx;
  SUNLogger logger;
  sunrealtype t;
  long netf;
  long ncfn;
  long nni;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  long local_90;
  double local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_a8 = 0;
  local_a0 = 0;
  local_b0 = 0;
  bVar8 = true;
  if (argc == 2) {
    iVar3 = atoi(argv[1]);
    bVar8 = iVar3 == 0;
  }
  uVar4 = SUNContext_Create(0,&local_a8);
  if ((int)uVar4 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    uVar4 = SUNLogger_Create(0,0,&local_a0);
    if ((int)uVar4 < 0) {
      pcVar7 = "SUNLogger_Create";
    }
    else if ((bVar8) ||
            (uVar4 = SUNLogger_SetInfoFilename(local_a0,"ark_brusselator_fp-info.txt"),
            -1 < (int)uVar4)) {
      uVar4 = SUNContext_SetLogger(local_a8,local_a0);
      if ((int)uVar4 < 0) {
        pcVar7 = "SUNContext_SetLogger";
      }
      else {
        puts("\nBrusselator ODE test problem, fixed-point solver:");
        printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0,0x4008000000000000,
               0x400c000000000000);
        printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",0,0x4008000000000000,
               0x3f40624dd2f1a9fc);
        printf("    reltol = %.1e,  abstol = %.1e\n\n",0xa0b5ed8d,0x3ddb7cdfd9d7bdbb);
        local_48 = 0;
        uStack_44 = 0x3fe00000;
        uStack_40 = 0;
        uStack_3c = 0x40080000;
        local_38 = 0x3f40624dd2f1a9fc;
        plVar5 = (long *)N_VNew_Serial(3,local_a8);
        if (plVar5 == (long *)0x0) {
          main_cold_3();
          return 1;
        }
        puVar1 = *(undefined8 **)(*plVar5 + 0x10);
        *puVar1 = 0x4008000000000000;
        puVar1[1] = 0x4008000000000000;
        puVar1[2] = 0x400c000000000000;
        local_b0 = ARKStepCreate(0,fe,fi,plVar5,local_a8);
        if (local_b0 == 0) {
          main_cold_2();
          return 1;
        }
        lVar6 = SUNNonlinSol_FixedPoint(plVar5,3,local_a8);
        if (lVar6 == 0) {
          main_cold_1();
          return 1;
        }
        uVar4 = ARKodeSetNonlinearSolver(local_b0,lVar6);
        if ((int)uVar4 < 0) {
          pcVar7 = "ARKodeSetNonlinearSolver";
        }
        else {
          uVar4 = ARKodeSetUserData(local_b0,&local_48);
          if ((int)uVar4 < 0) {
            pcVar7 = "ARKodeSetUserData";
          }
          else {
            uVar4 = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,local_b0);
            if ((int)uVar4 < 0) {
              pcVar7 = "ARKodeSStolerances";
            }
            else {
              uVar4 = ARKodeSetMaxNonlinIters(local_b0,10);
              if (-1 < (int)uVar4) {
                uVar4 = ARKodeSetAutonomous(local_b0,1);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeSetAutonomous",(ulong)uVar4);
                  return 1;
                }
                local_90 = lVar6;
                __s = fopen("solution.txt","w");
                fwrite("# t u v w\n",10,1,__s);
                puVar1 = *(undefined8 **)(*plVar5 + 0x10);
                fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
                local_98 = 0;
                puts("        t           u           v           w");
                puts("   ----------------------------------------------");
                dVar2 = 1.0;
                iVar3 = 10;
                do {
                  local_88 = dVar2;
                  uVar4 = ARKodeEvolve(local_b0,plVar5,&local_98,1);
                  if ((int)uVar4 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                            "ARKodeEvolve",(ulong)uVar4);
                    break;
                  }
                  puVar1 = *(undefined8 **)(*plVar5 + 0x10);
                  printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",(int)local_98,*puVar1,puVar1[1],
                         puVar1[2]);
                  puVar1 = *(undefined8 **)(*plVar5 + 0x10);
                  fprintf(__s," %.16e %.16e %.16e %.16e\n",(int)local_98,*puVar1,puVar1[1],puVar1[2]
                         );
                  dVar2 = 10.0;
                  if (local_88 + 1.0 <= 10.0) {
                    dVar2 = local_88 + 1.0;
                  }
                  iVar3 = iVar3 + -1;
                } while (iVar3 != 0);
                puts("   ----------------------------------------------");
                fclose(__s);
                uVar4 = ARKodeGetNumSteps(local_b0,&local_50);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumSteps",(ulong)uVar4);
                }
                uVar4 = ARKodeGetNumStepAttempts(local_b0,&local_58);
                lVar6 = local_90;
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumStepAttempts",(ulong)uVar4);
                }
                uVar4 = ARKodeGetNumRhsEvals(local_b0,0,&local_60);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumRhsEvals",(ulong)uVar4);
                }
                uVar4 = ARKodeGetNumRhsEvals(local_b0,1,&local_68);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumRhsEvals",(ulong)uVar4);
                }
                uVar4 = ARKodeGetNumErrTestFails(local_b0,&local_80);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumErrTestFails",(ulong)uVar4);
                }
                uVar4 = ARKodeGetNumNonlinSolvIters(local_b0,&local_70);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumNonlinSolvIters",(ulong)uVar4);
                }
                uVar4 = ARKodeGetNumNonlinSolvConvFails(local_b0,&local_78);
                if ((int)uVar4 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar4);
                }
                puts("\nFinal Solver Statistics:");
                printf("   Internal solver steps = %li (attempted = %li)\n",local_50,local_58);
                printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_60,local_68);
                printf("   Total number of fixed-point iterations = %li\n",local_70);
                printf("   Total number of nonlinear solver convergence failures = %li\n",local_78);
                printf("   Total number of error test failures = %li\n\n",local_80);
                N_VDestroy(plVar5);
                ARKodeFree(&local_b0);
                SUNNonlinSolFree(lVar6);
                SUNLogger_Destroy(&local_a0);
                SUNContext_Free(&local_a8);
                return 0;
              }
              pcVar7 = "ARKodeSetMaxNonlinIters";
            }
          }
        }
      }
    }
    else {
      pcVar7 = "SUNLogger_SetInfoFilename";
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar7,(ulong)uVar4);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);      /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);       /* time between outputs */
  sunindextype NEQ   = 3;                     /* number of dependent vars. */
  int Nt             = (int)ceil(Tf / dTout); /* number of output times */
  int test           = 3;                     /* test problem to run */
  sunrealtype reltol = 1.0e-6;                /* tolerances */
  sunrealtype abstol = 1.0e-10;
  int fp_m           = 3;  /* dimension of acceleration subspace */
  int maxcor         = 10; /* maximum # of nonlinear iterations/step */
  sunrealtype a, b, ep, u0, v0, w0;
  sunrealtype rdata[3];
  int monitor = 0; /* turn on/off monitoring */

  /* general problem variables */
  SUNContext ctx         = NULL;
  SUNLogger logger       = NULL;
  const char* info_fname = "ark_brusselator_fp-info.txt";
  int flag;                      /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  SUNNonlinearSolver NLS = NULL; /* empty nonlinear solver object */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nni, ncfn, netf;

  /* read inputs */
  if (argc == 2) { monitor = atoi(argv[1]); }

  /* create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  flag = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_flag(&flag, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    flag = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_flag(&flag, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  flag = SUNContext_SetLogger(ctx, logger);
  if (check_flag(&flag, "SUNContext_SetLogger", 1)) { return 1; }

  /* set up the test problem according to the desired test */
  if (test == 1)
  {
    u0 = SUN_RCONST(3.9);
    v0 = SUN_RCONST(1.1);
    w0 = SUN_RCONST(2.8);
    a  = SUN_RCONST(1.2);
    b  = SUN_RCONST(2.5);
    ep = SUN_RCONST(1.0e-5);
  }
  else if (test == 3)
  {
    u0 = SUN_RCONST(3.0);
    v0 = SUN_RCONST(3.0);
    w0 = SUN_RCONST(3.5);
    a  = SUN_RCONST(0.5);
    b  = SUN_RCONST(3.0);
    ep = SUN_RCONST(5.0e-4);
  }
  else
  {
    u0 = SUN_RCONST(1.2);
    v0 = SUN_RCONST(3.1);
    w0 = SUN_RCONST(3.0);
    a  = SUN_RCONST(1.0);
    b  = SUN_RCONST(3.5);
    ep = SUN_RCONST(5.0e-6);
  }

  /* Initial problem output */
  printf("\nBrusselator ODE test problem, fixed-point solver:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  rdata[0] = a; /* set user data  */
  rdata[1] = b;
  rdata[2] = ep;
  y        = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side functions in y'=fe(t,y)+fi(t,y),
     the initial time T0, and the initial dependent variable vector y. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Initialize fixed-point nonlinear solver and attach to ARKODE */
  NLS = SUNNonlinSol_FixedPoint(y, fp_m, ctx);
  if (check_flag((void*)NLS, "SUNNonlinSol_FixedPoint", 0)) { return 1; }

  flag = ARKodeSetNonlinearSolver(arkode_mem, NLS);
  if (check_flag(&flag, "ARKodeSetNonlinearSolver", 1)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)rdata); /* Pass rdata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  flag = ARKodeSetMaxNonlinIters(arkode_mem,
                                 maxcor); /* Increase default iterations */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }

  flag = ARKodeSetAutonomous(arkode_mem, SUNTRUE);
  if (check_flag(&flag, "ARKodeSetAutonomous", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfe);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 1, &nfi);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total number of fixed-point iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y);
  ARKodeFree(&arkode_mem);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&ctx);

  return 0;
}